

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Runtime.cpp
# Opt level: O0

void __thiscall runtime::VirtualMachine::LoadStringConstant(VirtualMachine *this)

{
  size_t sVar1;
  element_type *peVar2;
  size_type sVar3;
  const_reference val;
  allocator<char> local_39;
  string local_38;
  size_t local_18;
  size_t index;
  VirtualMachine *this_local;
  
  index = (size_t)this;
  sVar1 = getByteCodeParameter(this);
  local_18 = sVar1;
  peVar2 = std::
           __shared_ptr_access<const_bytecode::CompiledFile,_(__gnu_cxx::_Lock_policy)2,_false,_false>
           ::operator->((__shared_ptr_access<const_bytecode::CompiledFile,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                         *)&this->file);
  sVar3 = std::
          vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
          ::size(&peVar2->stringConstants);
  if (sVar3 <= sVar1) {
    std::allocator<char>::allocator();
    std::__cxx11::string::string<std::allocator<char>>
              ((string *)&local_38,"Index out of bounds in LoadStringConstant",&local_39);
    panic(this,&local_38);
  }
  peVar2 = std::
           __shared_ptr_access<const_bytecode::CompiledFile,_(__gnu_cxx::_Lock_policy)2,_false,_false>
           ::operator->((__shared_ptr_access<const_bytecode::CompiledFile,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                         *)&this->file);
  val = std::
        vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
        ::at(&peVar2->stringConstants,local_18);
  pushString(this,val);
  advance(this);
  return;
}

Assistant:

void runtime::VirtualMachine::LoadStringConstant() {
  std::size_t index = this->getByteCodeParameter();

  if (index >= this->file->stringConstants.size()) {
    this->panic("Index out of bounds in LoadStringConstant");
    return;
  }

  this->pushString(&this->file->stringConstants.at(index));

  this->advance();
}